

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall
FGUIDCVar::FGUIDCVar
          (FGUIDCVar *this,char *name,GUID *def,DWORD flags,_func_void_FGUIDCVar_ptr *callback)

{
  WORD WVar1;
  WORD WVar2;
  _func_void_FGUIDCVar_ptr *callback_local;
  DWORD flags_local;
  GUID *def_local;
  char *name_local;
  FGUIDCVar *this_local;
  
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,flags,(_func_void_FBaseCVar_ptr *)callback);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FGUIDCVar_009f1b10;
  if (def == (GUID *)0x0) {
    memset(&this->Value,0,0x10);
    memset(&this->DefaultValue,0,0x10);
  }
  else {
    WVar1 = def->Data2;
    WVar2 = def->Data3;
    (this->DefaultValue).Data1 = def->Data1;
    (this->DefaultValue).Data2 = WVar1;
    (this->DefaultValue).Data3 = WVar2;
    *(undefined8 *)(this->DefaultValue).Data4 = *(undefined8 *)def->Data4;
    if (((this->super_FBaseCVar).Flags & 0x80) != 0) {
      WVar1 = def->Data2;
      WVar2 = def->Data3;
      (this->Value).Data1 = def->Data1;
      (this->Value).Data2 = WVar1;
      (this->Value).Data3 = WVar2;
      *(undefined8 *)(this->Value).Data4 = *(undefined8 *)def->Data4;
    }
  }
  return;
}

Assistant:

FGUIDCVar::FGUIDCVar (const char *name, const GUID *def, DWORD flags, void (*callback)(FGUIDCVar &))
: FBaseCVar (name, flags, reinterpret_cast<void (*)(FBaseCVar &)>(callback))
{
	if (def != NULL)
	{
		DefaultValue = *def;
		if (Flags & CVAR_ISDEFAULT)
			Value = *def;
	}
	else
	{
		memset (&Value, 0, sizeof(DefaultValue));
		memset (&DefaultValue, 0, sizeof(DefaultValue));
	}
}